

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
::~hash_map(hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
            *this)

{
  clear(this);
  vector<crnlib::hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>::raw_node>
  ::~vector(&this->m_values);
  return;
}

Assistant:

inline ~hash_map()
        {
            clear();
        }